

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<std::vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>>
               (vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
                *value,ostream *os)

{
  ostream *os_local;
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  *value_local;
  
  ContainerPrinter::
  PrintValue<std::vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>,void>
            (value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}